

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::ByteBufferTEst_test_read_write_double_Test::TestBody
          (ByteBufferTEst_test_read_write_double_Test *this)

{
  char *pcVar1;
  double double2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  AssertionResult gtest_ar_1;
  AssertHelper local_78;
  double double1;
  ByteBuffer byte_buffer2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60 [5];
  ByteBuffer byte_buffer1;
  
  double1 = 583824.324;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(&byte_buffer1,8);
  bidfx_public_api::tools::ByteBuffer::WriteDouble(583824.324);
  gtest_ar_1._0_8_ = bidfx_public_api::tools::ByteBuffer::ReadDouble();
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&byte_buffer2,"double1","byte_buffer1.ReadDouble()",&double1,
             (double *)&gtest_ar_1);
  if (byte_buffer2 == (ByteBuffer)0x0) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (local_60[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((local_60[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&double2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xbe,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&double2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&double2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_60);
  double2 = -478324.423;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(&byte_buffer2,4);
  bidfx_public_api::tools::ByteBuffer::WriteDouble(-478324.423);
  local_90.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       bidfx_public_api::tools::ByteBuffer::ReadDouble();
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar_1,"double2","byte_buffer2.ReadDouble()",&double2,
             (double *)&local_90);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xc3,pcVar1);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&byte_buffer2);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&byte_buffer1);
  return;
}

Assistant:

TEST(ByteBufferTEst, test_read_write_double)
{
    double double1 = 583824.324;
    ByteBuffer byte_buffer1(8);
    byte_buffer1.WriteDouble(double1);
    EXPECT_EQ(double1, byte_buffer1.ReadDouble());

    double double2 = -478324.423;
    ByteBuffer byte_buffer2(4);
    byte_buffer2.WriteDouble(double2);
    EXPECT_EQ(double2, byte_buffer2.ReadDouble());
}